

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestSpec::ExcludedPattern::ExcludedPattern
          (ExcludedPattern *this,PatternPtr *underlyingPattern)

{
  element_type *this_00;
  Pattern *in_RSI;
  string *in_RDI;
  
  this_00 = clara::std::
            __shared_ptr_access<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x13b2c1);
  Pattern::name_abi_cxx11_(this_00);
  Pattern::Pattern(in_RSI,in_RDI);
  *(undefined ***)in_RDI = &PTR__ExcludedPattern_003322b8;
  clara::std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr
            ((shared_ptr<Catch::TestSpec::Pattern> *)in_RSI,
             (shared_ptr<Catch::TestSpec::Pattern> *)in_RDI);
  return;
}

Assistant:

TestSpec::ExcludedPattern::ExcludedPattern( PatternPtr const& underlyingPattern )
    : Pattern( underlyingPattern->name() )
    , m_underlyingPattern( underlyingPattern )
    {}